

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encrypt.c
# Opt level: O1

void HPDF_MD5Update(HPDF_MD5Context *ctx,HPDF_BYTE *buf,HPDF_UINT32 len)

{
  uint uVar1;
  int iVar2;
  uint n;
  HPDF_UINT32 n_00;
  
  uVar1 = ctx->bits[0];
  ctx->bits[0] = len * 8 + uVar1;
  if (CARRY4(len * 8,uVar1)) {
    ctx->bits[1] = ctx->bits[1] + 1;
  }
  ctx->bits[1] = ctx->bits[1] + (len >> 0x1d);
  uVar1 = uVar1 >> 3 & 0x3f;
  n_00 = len;
  if (uVar1 != 0) {
    n = 0x40 - uVar1;
    n_00 = len - n;
    if (len < n) {
      HPDF_MemCpy(ctx->in + uVar1,buf,len);
      n_00 = len;
    }
    else {
      HPDF_MemCpy(ctx->in + uVar1,buf,n);
      iVar2 = 6;
      do {
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0x16);
      MD5Transform(ctx->buf,(HPDF_UINT32 *)ctx->in);
      buf = buf + n;
    }
    if (len < n) {
      return;
    }
  }
  if (0x3f < n_00) {
    do {
      HPDF_MemCpy(ctx->in,buf,0x40);
      iVar2 = 6;
      do {
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0x16);
      MD5Transform(ctx->buf,(HPDF_UINT32 *)ctx->in);
      buf = buf + 0x40;
      n_00 = n_00 - 0x40;
    } while (0x3f < n_00);
  }
  HPDF_MemCpy(ctx->in,buf,n_00);
  return;
}

Assistant:

void
HPDF_MD5Update  (struct HPDF_MD5Context *ctx,
                 const HPDF_BYTE        *buf,
                 HPDF_UINT32            len)
{
    HPDF_UINT32 t;

    /* Update bitcount */

    t = ctx->bits[0];
    if ((ctx->bits[0] = t + ((HPDF_UINT32) len << 3)) < t)
        ctx->bits[1]++;     /* Carry from low to high */
    ctx->bits[1] += len >> 29;

    t = (t >> 3) & 0x3f; /* Bytes already in shsInfo->data */

    /* Handle any leading odd-sized chunks */

    if (t) {
        HPDF_BYTE *p = (HPDF_BYTE *) ctx->in + t;

        t = 64 - t;
        if (len < t)
        {
            HPDF_MemCpy (p, buf, len);
            return;
        }
        HPDF_MemCpy (p, buf, t);
        MD5ByteReverse (ctx->in, 16);
        MD5Transform (ctx->buf, (HPDF_UINT32 *) ctx->in);
        buf += t;
        len -= t;
    }
    /* Process data in 64-byte chunks */

    while (len >= 64) {
        HPDF_MemCpy (ctx->in, buf, 64);
        MD5ByteReverse (ctx->in, 16);
        MD5Transform (ctx->buf, (HPDF_UINT32 *) ctx->in);
        buf += 64;
        len -= 64;
    }

    /* Handle any remaining bytes of data. */

    HPDF_MemCpy (ctx->in, buf, len);
}